

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClassifier.cpp
# Opt level: O2

LPCUTF8 Js::CharClassifier::SkipIdentifierSurrogateStartEnd
                  (LPCUTF8 psz,LPCUTF8 end,CharClassifier *instance)

{
  bool bVar1;
  char16 cVar2;
  char16 cVar3;
  codepoint_t cVar4;
  LPCUTF8 local_40;
  LPCUTF8 currentPosition;
  DecodeOptions options;
  
  currentPosition._4_4_ = 1;
  local_40 = psz;
  cVar2 = utf8::Decode(&local_40,end,(DecodeOptions *)((long)&currentPosition + 4),(bool *)0x0);
  cVar4 = (codepoint_t)(ushort)cVar2;
  if ((currentPosition._4_4_ & 4) != 0) {
    cVar2 = utf8::Decode(&local_40,end,(DecodeOptions *)((long)&currentPosition + 4),(bool *)0x0);
    cVar4 = NumberUtilities::SurrogatePairAsCodePoint(cVar4,(uint)(ushort)cVar2);
  }
  bVar1 = IsIdStart(instance,cVar4);
  if (bVar1) {
    do {
      psz = local_40;
      cVar2 = utf8::Decode(&local_40,end,(DecodeOptions *)((long)&currentPosition + 4),(bool *)0x0);
      if (cVar2 == L'\0') {
        return psz;
      }
      cVar4 = (codepoint_t)(ushort)cVar2;
      if ((currentPosition._4_4_ & 4) != 0) {
        cVar3 = utf8::Decode(&local_40,end,(DecodeOptions *)((long)&currentPosition + 4),(bool *)0x0
                            );
        cVar4 = NumberUtilities::SurrogatePairAsCodePoint((uint)(ushort)cVar2,(uint)(ushort)cVar3);
      }
      bVar1 = IsIdContinue(instance,cVar4);
    } while (bVar1);
  }
  return psz;
}

Assistant:

const LPCUTF8 Js::CharClassifier::SkipIdentifierSurrogateStartEnd(LPCUTF8 psz, LPCUTF8 end, const CharClassifier *instance)
{

    LPCUTF8 currentPosition = psz;
    utf8::DecodeOptions options = utf8::doAllowThreeByteSurrogates;

    // Similar reasoning to above, however we do have surrogate identifiers, but less likely to occur in code.
    codepoint_t currentChar = utf8::Decode(currentPosition, end, options);

    if (options & utf8::doSecondSurrogatePair)
    {
        currentChar = Js::NumberUtilities::SurrogatePairAsCodePoint(currentChar, utf8::Decode(currentPosition, end, options));
    }

    if (!instance->IsIdStart(currentChar))
    {
        return psz;
    }

    psz = currentPosition;

    // Slow path is to check for a surrogate each iteration.
    // There is no new surrogate whitespaces as of yet, however, might be in the future, so surrogates still need to be checked
    // So, based on that, best way is to hit the slow path if the current character is not a whitespace in [0, FFFF];
    while((currentChar = utf8::Decode(currentPosition, end, options)) != '\0')
    {
        if (options & utf8::doSecondSurrogatePair)
        {
            currentChar = Js::NumberUtilities::SurrogatePairAsCodePoint(currentChar, utf8::Decode(currentPosition, end, options));
        }

        if (!instance->IsIdContinue(currentChar))
        {
            return psz;
        }

        psz = currentPosition;
    }

    return psz;
}